

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O2

void cfd::core::logger::log<unsigned_long&,std::__cxx11::string&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,unsigned_long *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char cVar1;
  basic_string_view<char> bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string asStack_68 [32];
  unsigned_long local_48 [2];
  pointer local_38;
  size_type sStack_30;
  
  cVar1 = cfd::core::logger::IsEnableLogLevel(lvl);
  if (cVar1 != '\0') {
    local_48[0] = *args;
    local_38 = (args_1->_M_dataplus)._M_p;
    sStack_30 = args_1->_M_string_length;
    bVar2 = ::fmt::v7::to_string_view<char,_0>(fmt);
    ::fmt::v7::detail::vformat_abi_cxx11_(asStack_68,bVar2.data_,bVar2.size_,0xd4,local_48);
    cfd::core::logger::WriteLog(source,lvl,asStack_68);
    std::__cxx11::string::~string(asStack_68);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}